

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collector.h
# Opt level: O0

void __thiscall
jaegertracing::thrift::CollectorProcessor::CollectorProcessor
          (CollectorProcessor *this,shared_ptr<jaegertracing::thrift::CollectorIf> *iface)

{
  mapped_type *pmVar1;
  allocator local_39;
  key_type local_38;
  shared_ptr<jaegertracing::thrift::CollectorIf> *local_18;
  shared_ptr<jaegertracing::thrift::CollectorIf> *iface_local;
  CollectorProcessor *this_local;
  
  local_18 = iface;
  iface_local = (shared_ptr<jaegertracing::thrift::CollectorIf> *)this;
  apache::thrift::TDispatchProcessor::TDispatchProcessor(&this->super_TDispatchProcessor);
  (this->super_TDispatchProcessor).super_TProcessor._vptr_TProcessor =
       (_func_int **)&PTR__CollectorProcessor_00518068;
  std::shared_ptr<jaegertracing::thrift::CollectorIf>::shared_ptr(&this->iface_,iface);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::CollectorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::CollectorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
  ::map(&this->processMap_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"submitBatches",&local_39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::CollectorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::CollectorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
           ::operator[](&this->processMap_,&local_38);
  *pmVar1 = (mapped_type)process_submitBatches;
  pmVar1[1] = 0;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

CollectorProcessor(::std::shared_ptr<CollectorIf> iface) :
    iface_(iface) {
    processMap_["submitBatches"] = &CollectorProcessor::process_submitBatches;
  }